

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_for_each.cpp
# Opt level: O1

void stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  int *piVar1;
  code *pcVar2;
  double dVar3;
  pointer puVar4;
  pointer puVar5;
  char extraout_AL;
  bool bVar6;
  char extraout_AL_00;
  char extraout_AL_01;
  int iVar7;
  long lVar8;
  ulong uVar9;
  Executor *this;
  pointer *__ptr;
  default_delete<tf::Node> *this_00;
  size_t sVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 uVar12;
  DefaultTaskParams local_36d;
  int local_36c;
  Expression_lhs<const_std::atomic<int>_&> local_368;
  unsigned_long local_358;
  atomic<int> counter;
  in_place_type_t<tf::Node::Runtime> local_349 [9];
  Result local_340;
  ResultBuilder DOCTEST_RB;
  Task pf1;
  Task pf2;
  size_t half;
  iterator beg;
  vector<int,_std::allocator<int>_> vec;
  size_t iend;
  size_t ibeg;
  iterator end;
  Task init;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  if (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  counter.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_358 = 0;
  lVar8 = 0;
  while( true ) {
    puVar5 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar7 = *(int *)((long)&DAT_001592b8 + lVar8);
    beg._M_current = (int *)0x0;
    end._M_current = (int *)0x0;
    ibeg = 0;
    iend = 0;
    half = local_358 >> 1;
    this_00 = (default_delete<tf::Node> *)
              taskflow._graph.
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              .
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (*(Node **)this_00 != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()(this_00,*(Node **)this_00);
        }
        *(undefined8 *)this_00 = 0;
        this_00 = this_00 + 8;
      } while (this_00 != (default_delete<tf::Node> *)puVar5);
      taskflow._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar4;
    }
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&vec;
    DOCTEST_RB.super_AssertData._8_8_ = &local_358;
    DOCTEST_RB.super_AssertData._24_8_ = &end;
    DOCTEST_RB.super_AssertData.m_expr = (char *)&half;
    DOCTEST_RB.super_AssertData._40_8_ = &ibeg;
    DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr = (char *)&iend;
    local_340.m_passed = false;
    local_340._1_7_ = 0;
    local_368.lhs = (atomic<int> *)0x0;
    pf1._node = pf1._node & 0xffffffff00000000;
    DOCTEST_RB.super_AssertData.m_file = (char *)&beg;
    DOCTEST_RB.super_AssertData.m_exception.field_0._8_8_ = &counter;
    init._node = tf::Graph::
                 _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Static>,stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda()_1_>
                           (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                            (DefaultTaskParams *)&pf2,(void **)&local_340,&local_368.lhs,(int *)&pf1
                            ,(in_place_type_t<tf::Node::Static> *)&local_36c,
                            (anon_class_64_8_523e6f90 *)&DOCTEST_RB);
    pf1._node = (Node *)0x0;
    pf2._node = (Node *)0x0;
    DOCTEST_RB.super_AssertData._8_8_ = &end;
    local_340.m_passed = false;
    local_340._1_7_ = 0;
    local_368.lhs = (atomic<int> *)0x0;
    local_36c = 0;
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&beg;
    DOCTEST_RB.super_AssertData.m_file = (char *)(long)iVar7;
    DOCTEST_RB.super_AssertData.m_expr = (char *)&counter;
    pf1._node = tf::Graph::
                _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_for_each_task<std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(int&)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(int&)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
                          (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                           &local_36d,(void **)&local_340,&local_368.lhs,&local_36c,local_349,
                           (anon_class_40_4_a91bfa1b_conflict *)&DOCTEST_RB);
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&ibeg;
    DOCTEST_RB.super_AssertData._8_8_ = &iend;
    DOCTEST_RB.super_AssertData.m_file = (char *)0x1;
    DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr = (char *)&vec;
    local_340.m_passed = false;
    local_340._1_7_ = 0;
    local_368.lhs = (atomic<int> *)0x0;
    local_36c = 0;
    DOCTEST_RB.super_AssertData._24_8_ = (char *)(long)iVar7;
    DOCTEST_RB.super_AssertData._40_8_ = &counter;
    pf2._node = tf::Graph::
                _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_for_each_index_task<std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,unsigned_long,stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(unsigned_long)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,unsigned_long,stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(unsigned_long)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
                          (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                           &local_36d,(void **)&local_340,&local_368.lhs,&local_36c,local_349,
                           (anon_class_56_5_086014e6 *)&DOCTEST_RB);
    tf::Task::precede<tf::Task&,tf::Task&>(&init,&pf1,&pf2);
    local_340.m_passed = true;
    local_340._1_7_ = 0;
    this = &executor;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              ((Future<void> *)&DOCTEST_RB,this,&taskflow,(anon_class_8_1_69701ed9 *)&local_340,
               (anon_class_1_0_00000001 *)&local_368);
    if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) break;
    std::__future_base::_State_baseV2::wait
              ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,this);
    if (DOCTEST_RB.super_AssertData._24_8_ != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        iVar7 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar7 = *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc) = iVar7 + -1;
      }
      if (iVar7 == 1) {
        (**(code **)(*(long *)DOCTEST_RB.super_AssertData._24_8_ + 0x18))();
      }
    }
    if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)DOCTEST_RB.super_AssertData._8_8_);
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr =
         (char *)((ulong)DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr &
                 0xffffffffffffff00);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x145;
    DOCTEST_RB.super_AssertData.m_expr = "counter == n";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_368.lhs = &counter;
    local_368.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_std::atomic<int>_&>::operator==<unsigned_long,_nullptr>
              (&local_340,&local_368,&local_358);
    doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_340.m_decomp);
    DOCTEST_RB.super_AssertData._40_8_ =
         CONCAT71(DOCTEST_RB.super_AssertData._41_7_,local_340.m_passed) ^ 1;
    uVar11 = extraout_XMM0_Da;
    uVar12 = extraout_XMM0_Db;
    if ((local_340.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_340.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_340.m_decomp.field_0.data.ptr);
      uVar11 = extraout_XMM0_Da_00;
      uVar12 = extraout_XMM0_Db_00;
    }
    dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar12,uVar11));
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    if (DOCTEST_RB.super_AssertData.m_failed == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
      if (bVar6) goto LAB_00137e71;
    }
    if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       (DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr);
    }
    if (half != 0) {
      uVar9 = 0;
      do {
        DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr =
             (char *)((ulong)DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr &
                     0xffffffffffffff00);
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x148;
        DOCTEST_RB.super_AssertData.m_expr = "vec[i] == 8";
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        local_368.lhs =
             (atomic<int> *)
             (vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start + uVar9);
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        local_368.m_at = DT_REQUIRE;
        local_36c = 8;
        doctest::detail::Expression_lhs<int_const&>::operator==
                  (&local_340,(Expression_lhs<int_const&> *)&local_368,&local_36c);
        doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_340.m_decomp);
        DOCTEST_RB.super_AssertData._40_8_ =
             CONCAT71(DOCTEST_RB.super_AssertData._41_7_,local_340.m_passed) ^ 1;
        uVar11 = extraout_XMM0_Da_01;
        uVar12 = extraout_XMM0_Db_01;
        if ((local_340.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_340.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_340.m_decomp.field_0.data.ptr);
          uVar11 = extraout_XMM0_Da_02;
          uVar12 = extraout_XMM0_Db_02;
        }
        dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar12,uVar11));
        if (extraout_AL_00 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        if (DOCTEST_RB.super_AssertData.m_failed == true) {
          bVar6 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
          if (bVar6) {
            doctest::detail::throwException();
          }
        }
        if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           (DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr);
        }
        vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar9] = 0;
        uVar9 = uVar9 + 1;
      } while (uVar9 < half);
    }
    sVar10 = half;
    if (half < local_358) {
      do {
        DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr =
             (char *)((ulong)DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr &
                     0xffffffffffffff00);
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x14d;
        DOCTEST_RB.super_AssertData.m_expr = "vec[i] == -8";
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        local_368.lhs =
             (atomic<int> *)
             (vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start + sVar10);
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        local_368.m_at = DT_REQUIRE;
        local_36c = -8;
        doctest::detail::Expression_lhs<int_const&>::operator==
                  (&local_340,(Expression_lhs<int_const&> *)&local_368,&local_36c);
        doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_340.m_decomp);
        DOCTEST_RB.super_AssertData._40_8_ =
             CONCAT71(DOCTEST_RB.super_AssertData._41_7_,local_340.m_passed) ^ 1;
        uVar11 = extraout_XMM0_Da_03;
        uVar12 = extraout_XMM0_Db_03;
        if ((local_340.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_340.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_340.m_decomp.field_0.data.ptr);
          uVar11 = extraout_XMM0_Da_04;
          uVar12 = extraout_XMM0_Db_04;
        }
        dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar12,uVar11));
        if (extraout_AL_01 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        if (DOCTEST_RB.super_AssertData.m_failed == true) {
          bVar6 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
          if (bVar6) {
            doctest::detail::throwException();
          }
        }
        if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           (DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr);
        }
        vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [sVar10] = 0;
        sVar10 = sVar10 + 1;
      } while (sVar10 < local_358);
    }
    lVar8 = lVar8 + 4;
    if (lVar8 == 0x14) {
      local_358 = local_358 + 1;
      lVar8 = 0;
      if (0x96 < local_358) {
        if (vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        tf::Taskflow::~Taskflow(&taskflow);
        tf::Executor::~Executor(&executor);
        return;
      }
    }
  }
  std::__throw_future_error(3);
LAB_00137e71:
  doctest::detail::throwException();
}

Assistant:

void stateful_for_each(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;
  std::vector<int> vec;
  std::atomic<int> counter {0};

  for(size_t n = 0; n <= 150; n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      std::vector<int>::iterator beg, end;
      size_t ibeg = 0, iend = 0;
      size_t half = n/2;

      taskflow.clear();

      auto init = taskflow.emplace([&](){
        vec.resize(n);
        std::fill_n(vec.begin(), vec.size(), -1);

        beg = vec.begin();
        end = beg + half;

        ibeg = half;
        iend = n;

        counter = 0;
      });

      tf::Task pf1, pf2;

      pf1 = taskflow.for_each(
        std::ref(beg), std::ref(end), [&](int& i){
        counter++;
        i = 8;
      }, P(c));

      pf2 = taskflow.for_each_index(
        std::ref(ibeg), std::ref(iend), size_t{1}, [&] (size_t i) {
          counter++;
          vec[i] = -8;
      }, P(c));

      init.precede(pf1, pf2);

      executor.run(taskflow).wait();
      REQUIRE(counter == n);

      for(size_t i=0; i<half; ++i) {
        REQUIRE(vec[i] == 8);
        vec[i] = 0;
      }

      for(size_t i=half; i<n; ++i) {
        REQUIRE(vec[i] == -8);
        vec[i] = 0;
      }
    }
  }
}